

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

bool depspawn::internal::is_contained(Workitem *w,Workitem *ancestor)

{
  bool bVar1;
  arg_info *in_RSI;
  long in_RDI;
  arg_info *arg_p;
  arg_info *arg_w;
  array_range_t local_28;
  arg_info *this;
  
  this = *(arg_info **)(in_RDI + 0x10);
  local_28 = (array_range_t)in_RSI->array_range;
  while( true ) {
    if (local_28 == (array_range_t)0x0 || this == (arg_info *)0x0) {
      return this == (arg_info *)0x0;
    }
    if (this->addr < (ulong)*(array_range_t *)local_28) break;
    bVar1 = arg_info::is_array(this);
    if (bVar1) {
      if (*(array_range_t *)local_28 == (array_range_t)this->addr) {
        bVar1 = arg_info::is_contained_array(in_RSI,this);
        if (!bVar1) {
          return false;
        }
        this = this->next;
      }
      else {
        local_28 = *(array_range_t *)((long)local_28 + 0x18);
      }
    }
    else if (*(ulong *)local_28 + *(ulong *)((long)local_28 + 8) < this->addr + this->size) {
      local_28 = *(array_range_t *)((long)local_28 + 0x18);
    }
    else {
      this = this->next;
    }
  }
  return false;
}

Assistant:

bool is_contained(const Workitem* const w, const Workitem * const ancestor)
    {
      const arg_info *arg_w = w->args;
      const arg_info *arg_p = ancestor->args;
      
      while(arg_p && arg_w) {
        
        if (arg_w->addr < arg_p->addr) {
          return false;
        }
        
        if (arg_w->is_array()) {
          if(arg_p->addr == arg_w->addr) {
            if(!arg_w->is_contained_array(arg_p))
              return false;
            //Same array. Was contained => progress w
            arg_w = arg_w->next;
          } else { // Different array, arg_w->addr > arg_p->addr => progress p
            arg_p = arg_p->next;
          }
        } else { //Here arg_p->addr <= arg_w->addr
          if ((arg_w->addr + arg_w->size) <= (arg_p->addr + arg_p->size) ) {
            arg_w = arg_w->next;
          } else {
            arg_p = arg_p->next;
          }
        }
        
      }
      
      return arg_w == nullptr;
    }